

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_v4dwt_decode(opj_v4dwt_t *dwt)

{
  opj_v4_t *w;
  OPJ_INT32 count;
  int iVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float *pfVar9;
  float *pfVar10;
  opj_v4_t *poVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  opj_v4_t *poVar16;
  int iVar17;
  opj_v4_t *w_00;
  undefined4 in_XMM1_Da;
  OPJ_FLOAT32 OVar18;
  undefined4 in_XMM1_Db;
  OPJ_FLOAT32 OVar19;
  OPJ_FLOAT32 OVar20;
  OPJ_FLOAT32 OVar21;
  __m128 c;
  __m128 c_00;
  
  if (dwt->cas == 0) {
    iVar12 = dwt->sn;
    if (iVar12 < 2 && dwt->dn < 1) {
      return;
    }
    iVar15 = 1;
    iVar13 = 0;
  }
  else {
    iVar12 = dwt->sn;
    iVar13 = 1;
    iVar15 = 0;
    if ((iVar12 < 1) && (iVar15 = 0, dwt->dn < 2)) {
      return;
    }
  }
  poVar11 = dwt->wavelet;
  w = (opj_v4_t *)((long)poVar11 + (ulong)(uint)(iVar13 << 4));
  c[3] = (float)in_XMM1_Db;
  c[2] = (float)in_XMM1_Da;
  c[0] = 1.2301741;
  c[1] = 1.2301741;
  opj_v4dwt_decode_step1_sse(w,iVar12,c);
  w_00 = (opj_v4_t *)((ulong)(uint)(iVar15 << 4) + (long)poVar11);
  count = dwt->dn;
  c_00[3] = (float)in_XMM1_Db;
  c_00[2] = (float)in_XMM1_Da;
  c_00[0] = 1.6257324;
  c_00[1] = 1.6257324;
  opj_v4dwt_decode_step1_sse(w_00,count,c_00);
  pfVar9 = (float *)((long)poVar11 + (ulong)(uint)(iVar13 << 4) + 0x10);
  iVar13 = count - iVar13;
  iVar1 = iVar13;
  if (iVar12 < iVar13) {
    iVar1 = iVar12;
  }
  pfVar10 = pfVar9;
  if (0 < iVar1) {
    OVar18 = w_00->f[0];
    OVar19 = w_00->f[1];
    OVar20 = w_00->f[2];
    OVar21 = w_00->f[3];
    iVar14 = iVar1;
    do {
      fVar2 = *pfVar10;
      pfVar3 = pfVar10 + 1;
      pfVar4 = pfVar10 + 2;
      pfVar5 = pfVar10 + 3;
      pfVar10[-4] = ((float)OVar18 + fVar2) * -0.44350687 + pfVar10[-4];
      pfVar10[-3] = ((float)OVar19 + *pfVar3) * -0.44350687 + pfVar10[-3];
      pfVar10[-2] = ((float)OVar20 + *pfVar4) * -0.44350687 + pfVar10[-2];
      pfVar10[-1] = ((float)OVar21 + *pfVar5) * -0.44350687 + pfVar10[-1];
      pfVar10 = pfVar10 + 8;
      iVar14 = iVar14 + -1;
      OVar18 = (OPJ_FLOAT32)fVar2;
      OVar19 = (OPJ_FLOAT32)*pfVar3;
      OVar20 = (OPJ_FLOAT32)*pfVar4;
      OVar21 = (OPJ_FLOAT32)*pfVar5;
    } while (iVar14 != 0);
  }
  if (iVar13 < iVar12) {
    fVar2 = pfVar10[-8];
    fVar6 = pfVar10[-7];
    fVar7 = pfVar10[-6];
    fVar8 = pfVar10[-5];
    iVar14 = iVar12 - iVar1;
    pfVar10 = pfVar10 + -4;
    do {
      *pfVar10 = *pfVar10 - fVar2 * 0.88701373;
      pfVar10[1] = pfVar10[1] - fVar6 * 0.88701373;
      pfVar10[2] = pfVar10[2] - fVar7 * 0.88701373;
      pfVar10[3] = pfVar10[3] - fVar8 * 0.88701373;
      pfVar10 = pfVar10 + 8;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  poVar11 = w_00 + 1;
  iVar15 = iVar12 - iVar15;
  iVar14 = iVar15;
  if (count < iVar15) {
    iVar14 = count;
  }
  poVar16 = poVar11;
  if (0 < iVar14) {
    OVar18 = w->f[0];
    OVar19 = w->f[1];
    OVar20 = w->f[2];
    OVar21 = w->f[3];
    iVar17 = iVar14;
    do {
      fVar2 = (float)poVar16->f[0];
      pfVar10 = (float *)(poVar16->f + 1);
      pfVar3 = (float *)(poVar16->f + 2);
      pfVar4 = (float *)(poVar16->f + 3);
      poVar16[-1].f[0] =
           (OPJ_FLOAT32)(((float)OVar18 + fVar2) * -0.8829111 + (float)poVar16[-1].f[0]);
      *(float *)((long)poVar16 + -0xc) =
           ((float)OVar19 + *pfVar10) * -0.8829111 + *(float *)((long)poVar16 + -0xc);
      *(float *)((long)poVar16 + -8) =
           ((float)OVar20 + *pfVar3) * -0.8829111 + *(float *)((long)poVar16 + -8);
      *(float *)((long)poVar16 + -4) =
           ((float)OVar21 + *pfVar4) * -0.8829111 + *(float *)((long)poVar16 + -4);
      poVar16 = poVar16 + 2;
      iVar17 = iVar17 + -1;
      OVar18 = (OPJ_FLOAT32)fVar2;
      OVar19 = (OPJ_FLOAT32)*pfVar10;
      OVar20 = (OPJ_FLOAT32)*pfVar3;
      OVar21 = (OPJ_FLOAT32)*pfVar4;
    } while (iVar17 != 0);
  }
  if (iVar15 < count) {
    fVar2 = (float)poVar16[-2].f[0];
    fVar6 = *(float *)((long)poVar16 + -0x1c);
    fVar7 = *(float *)((long)poVar16 + -0x18);
    fVar8 = *(float *)((long)poVar16 + -0x14);
    iVar17 = count - iVar14;
    poVar16 = poVar16 + -1;
    do {
      poVar16->f[0] = (OPJ_FLOAT32)((float)poVar16->f[0] - fVar2 * 1.7658222);
      poVar16->f[1] = (OPJ_FLOAT32)((float)poVar16->f[1] - fVar6 * 1.7658222);
      poVar16->f[2] = (OPJ_FLOAT32)((float)poVar16->f[2] - fVar7 * 1.7658222);
      poVar16->f[3] = (OPJ_FLOAT32)((float)poVar16->f[3] - fVar8 * 1.7658222);
      poVar16 = poVar16 + 2;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  if (0 < iVar1) {
    OVar18 = w_00->f[0];
    OVar19 = w_00->f[1];
    OVar20 = w_00->f[2];
    OVar21 = w_00->f[3];
    iVar17 = iVar1;
    do {
      fVar2 = *pfVar9;
      pfVar10 = pfVar9 + 1;
      pfVar3 = pfVar9 + 2;
      pfVar4 = pfVar9 + 3;
      pfVar9[-4] = ((float)OVar18 + fVar2) * 0.052980117 + pfVar9[-4];
      pfVar9[-3] = ((float)OVar19 + *pfVar10) * 0.052980117 + pfVar9[-3];
      pfVar9[-2] = ((float)OVar20 + *pfVar3) * 0.052980117 + pfVar9[-2];
      pfVar9[-1] = ((float)OVar21 + *pfVar4) * 0.052980117 + pfVar9[-1];
      pfVar9 = pfVar9 + 8;
      iVar17 = iVar17 + -1;
      OVar18 = (OPJ_FLOAT32)fVar2;
      OVar19 = (OPJ_FLOAT32)*pfVar10;
      OVar20 = (OPJ_FLOAT32)*pfVar3;
      OVar21 = (OPJ_FLOAT32)*pfVar4;
    } while (iVar17 != 0);
  }
  if (iVar13 < iVar12) {
    fVar2 = pfVar9[-8];
    fVar6 = pfVar9[-7];
    fVar7 = pfVar9[-6];
    fVar8 = pfVar9[-5];
    iVar12 = iVar12 - iVar1;
    pfVar9 = pfVar9 + -4;
    do {
      *pfVar9 = *pfVar9 + fVar2 * 0.105960235;
      pfVar9[1] = pfVar9[1] + fVar6 * 0.105960235;
      pfVar9[2] = pfVar9[2] + fVar7 * 0.105960235;
      pfVar9[3] = pfVar9[3] + fVar8 * 0.105960235;
      pfVar9 = pfVar9 + 8;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  if (0 < iVar14) {
    OVar18 = w->f[0];
    OVar19 = w->f[1];
    OVar20 = w->f[2];
    OVar21 = w->f[3];
    iVar12 = iVar14;
    do {
      fVar2 = (float)poVar11->f[0];
      pfVar9 = (float *)(poVar11->f + 1);
      pfVar10 = (float *)(poVar11->f + 2);
      pfVar3 = (float *)(poVar11->f + 3);
      poVar11[-1].f[0] =
           (OPJ_FLOAT32)(((float)OVar18 + fVar2) * 1.5861343 + (float)poVar11[-1].f[0]);
      *(float *)((long)poVar11 + -0xc) =
           ((float)OVar19 + *pfVar9) * 1.5861343 + *(float *)((long)poVar11 + -0xc);
      *(float *)((long)poVar11 + -8) =
           ((float)OVar20 + *pfVar10) * 1.5861343 + *(float *)((long)poVar11 + -8);
      *(float *)((long)poVar11 + -4) =
           ((float)OVar21 + *pfVar3) * 1.5861343 + *(float *)((long)poVar11 + -4);
      poVar11 = poVar11 + 2;
      iVar12 = iVar12 + -1;
      OVar18 = (OPJ_FLOAT32)fVar2;
      OVar19 = (OPJ_FLOAT32)*pfVar9;
      OVar20 = (OPJ_FLOAT32)*pfVar10;
      OVar21 = (OPJ_FLOAT32)*pfVar3;
    } while (iVar12 != 0);
  }
  if (iVar15 < count) {
    fVar2 = (float)poVar11[-2].f[0];
    fVar6 = *(float *)((long)poVar11 + -0x1c);
    fVar7 = *(float *)((long)poVar11 + -0x18);
    fVar8 = *(float *)((long)poVar11 + -0x14);
    iVar14 = count - iVar14;
    poVar11 = poVar11 + -1;
    do {
      poVar11->f[0] = (OPJ_FLOAT32)((float)poVar11->f[0] + fVar2 * 3.1722686);
      poVar11->f[1] = (OPJ_FLOAT32)((float)poVar11->f[1] + fVar6 * 3.1722686);
      poVar11->f[2] = (OPJ_FLOAT32)((float)poVar11->f[2] + fVar7 * 3.1722686);
      poVar11->f[3] = (OPJ_FLOAT32)((float)poVar11->f[3] + fVar8 * 3.1722686);
      poVar11 = poVar11 + 2;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  return;
}

Assistant:

static void opj_v4dwt_decode(opj_v4dwt_t* OPJ_RESTRICT dwt)
{
	OPJ_INT32 a, b;
	if(dwt->cas == 0) {
		if(!((dwt->dn > 0) || (dwt->sn > 1))){
			return;
		}
		a = 0;
		b = 1;
	}else{
		if(!((dwt->sn > 0) || (dwt->dn > 1))) {
			return;
		}
		a = 1;
		b = 0;
	}
#ifdef __SSE__
	opj_v4dwt_decode_step1_sse(dwt->wavelet+a, dwt->sn, _mm_set1_ps(opj_K));
	opj_v4dwt_decode_step1_sse(dwt->wavelet+b, dwt->dn, _mm_set1_ps(opj_c13318));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), _mm_set1_ps(opj_dwt_delta));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), _mm_set1_ps(opj_dwt_gamma));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), _mm_set1_ps(opj_dwt_beta));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), _mm_set1_ps(opj_dwt_alpha));
#else
	opj_v4dwt_decode_step1(dwt->wavelet+a, dwt->sn, opj_K);
	opj_v4dwt_decode_step1(dwt->wavelet+b, dwt->dn, opj_c13318);
	opj_v4dwt_decode_step2(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), opj_dwt_delta);
	opj_v4dwt_decode_step2(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), opj_dwt_gamma);
	opj_v4dwt_decode_step2(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), opj_dwt_beta);
	opj_v4dwt_decode_step2(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), opj_dwt_alpha);
#endif
}